

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O0

void mcode_allocarea(jit_State *J)

{
  MCode *pMVar1;
  ulong sz_00;
  MCode *pMVar2;
  uint8_t *puVar3;
  size_t sz;
  MCode *oldarea;
  jit_State *J_local;
  
  pMVar1 = J->mcarea;
  sz_00 = (long)J->param[0xd] * 0x400 + 0xfffU & 0xfffffffffffff000;
  pMVar2 = (MCode *)mcode_alloc(J,sz_00);
  J->mcarea = pMVar2;
  J->szmcarea = sz_00;
  J->mcprot = 3;
  J->mctop = J->mcarea + J->szmcarea;
  J->mcbot = J->mcarea + 0x10;
  *(MCode **)J->mcarea = pMVar1;
  *(ulong *)(J->mcarea + 8) = sz_00;
  J->szallmcarea = sz_00 + J->szallmcarea;
  puVar3 = lj_err_register_mcode(J->mcarea,sz_00,J->mcbot);
  J->mcbot = puVar3;
  return;
}

Assistant:

static void mcode_allocarea(jit_State *J)
{
  MCode *oldarea = J->mcarea;
  size_t sz = (size_t)J->param[JIT_P_sizemcode] << 10;
  sz = (sz + LJ_PAGESIZE-1) & ~(size_t)(LJ_PAGESIZE - 1);
  J->mcarea = (MCode *)mcode_alloc(J, sz);
  J->szmcarea = sz;
  J->mcprot = MCPROT_GEN;
  J->mctop = (MCode *)((char *)J->mcarea + J->szmcarea);
  J->mcbot = (MCode *)((char *)J->mcarea + sizeof(MCLink));
  ((MCLink *)J->mcarea)->next = oldarea;
  ((MCLink *)J->mcarea)->size = sz;
  J->szallmcarea += sz;
  J->mcbot = (MCode *)lj_err_register_mcode(J->mcarea, sz, (uint8_t *)J->mcbot);
}